

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseProcessorInstance(StructuralParser *this,Graph *graph)

{
  bool bVar1;
  ProcessorInstance *pPVar2;
  UnqualifiedName *o;
  QualifiedIdentifier *o_00;
  Expression *pEVar3;
  pool_ptr<soul::AST::Expression> local_e0;
  char *local_d8;
  pool_ptr<soul::AST::Expression> local_d0;
  char *local_c8;
  undefined1 local_c0 [96];
  char *local_60;
  UTF8Reader local_58;
  pool_ptr<soul::AST::UnqualifiedName> local_50 [3];
  Context local_38;
  ProcessorInstance *local_20;
  ProcessorInstance *u;
  Graph *graph_local;
  StructuralParser *this_local;
  
  u = (ProcessorInstance *)graph;
  graph_local = (Graph *)this;
  getContext(&local_38,this);
  pPVar2 = allocate<soul::AST::ProcessorInstance,soul::AST::Context>(this,&local_38);
  AST::Context::~Context(&local_38);
  local_20 = pPVar2;
  o = parseUnqualifiedName(this);
  pool_ptr<soul::AST::UnqualifiedName>::pool_ptr<soul::AST::UnqualifiedName,void>(local_50,o);
  (local_20->instanceName).object = local_50[0].object;
  pool_ptr<soul::AST::UnqualifiedName>::~pool_ptr(local_50);
  AST::Graph::addProcessorInstance((Graph *)u,local_20);
  local_58.data = "=";
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e52c);
  local_60 = "$identifier";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)"$identifier");
  if (!bVar1) {
    Errors::expectedProcessorName<>();
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,local_c0 + 0x28);
    CompileMessage::~CompileMessage((CompileMessage *)(local_c0 + 0x28));
  }
  o_00 = parseQualifiedIdentifier(this);
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::QualifiedIdentifier,void>
            ((pool_ptr<soul::AST::Expression> *)(local_c0 + 0x20),o_00);
  (local_20->targetProcessor).object = (Expression *)local_c0._32_8_;
  pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)(local_c0 + 0x20));
  local_c0._24_8_ = "[";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x575e01);
  if (bVar1) {
    pEVar3 = parseExpression(this,false);
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
              ((pool_ptr<soul::AST::Expression> *)(local_c0 + 0x10),pEVar3);
    (local_20->arraySize).object = (Expression *)local_c0._16_8_;
    pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)(local_c0 + 0x10))
    ;
    local_c0._8_8_ = "]";
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54ace4);
  }
  parseSpecialisationArgs((StructuralParser *)local_c0);
  (local_20->specialisationArgs).object = (Expression *)local_c0._0_8_;
  pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_c0);
  local_c8 = "*";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x5747cb);
  if (bVar1) {
    pEVar3 = parseExpression(this,false);
    pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_d0,pEVar3);
    (local_20->clockMultiplierRatio).object = local_d0.object;
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_d0);
  }
  else {
    local_d8 = "/";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54d9a0);
    if (bVar1) {
      pEVar3 = parseExpression(this,false);
      pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_e0,pEVar3);
      (local_20->clockDividerRatio).object = local_e0.object;
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_e0);
    }
  }
  return;
}

Assistant:

void parseProcessorInstance (AST::Graph& graph)
    {
        auto& u = allocate<AST::ProcessorInstance> (getContext());
        u.instanceName = parseUnqualifiedName();
        graph.addProcessorInstance (u);

        expect (Operator::assign);

        if (! matches (Token::identifier))
            throwError (Errors::expectedProcessorName());

        u.targetProcessor = parseQualifiedIdentifier();

        // Array of processors
        if (matchIf (Operator::openBracket))
        {
            u.arraySize = parseExpression();
            expect (Operator::closeBracket);
        }

        // Parameterised
        u.specialisationArgs = parseSpecialisationArgs();

        // Clocked
        if (matchIf (Operator::times))
            u.clockMultiplierRatio = parseExpression();
        else if (matchIf (Operator::divide))
            u.clockDividerRatio = parseExpression();
    }